

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_md5.cpp
# Opt level: O2

void __thiscall ON_MD5::AccumulateBytes(ON_MD5 *this,void *buffer,ON__UINT64 sizeof_buffer)

{
  if (sizeof_buffer != 0 && buffer != (void *)0x0) {
    if ((this->m_status_bits & 1) == 0) {
      Reset(this);
    }
    this->m_status_bits = 1;
    this->m_byte_count = this->m_byte_count + sizeof_buffer;
    for (; 0xfffffff < sizeof_buffer; sizeof_buffer = sizeof_buffer - 0xfffffff) {
      Internal_Accumulate(this,(ON__UINT8 *)buffer,0xfffffff);
      buffer = (void *)((long)buffer + 0xfffffff);
    }
    Internal_Accumulate(this,(ON__UINT8 *)buffer,(ON__UINT32)sizeof_buffer);
    return;
  }
  return;
}

Assistant:

void ON_MD5::AccumulateBytes(
  const void* buffer,
  ON__UINT64 sizeof_buffer
  )
{
  if (nullptr != buffer && sizeof_buffer > 0)
  {
    if (1 != (1 & m_status_bits))
      Reset();
    m_status_bits = 1; // invalidate any intermediate cached m_digest value.
    m_byte_count += sizeof_buffer;
    const ON__UINT32 max_length = 0x0FFFFFFFU;
    const ON__UINT8* p = (const ON__UINT8*)buffer;
    while (sizeof_buffer > max_length)
    {
      Internal_Accumulate(p,max_length);
      sizeof_buffer -= max_length;
      p += max_length;
    }
    Internal_Accumulate(p,(ON__UINT32)sizeof_buffer);
  }
}